

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZHelpers.cpp
# Opt level: O1

void s_recv_padding(socket_t *socket,string_view trace)

{
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> resp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  s_recv<std::__cxx11::string>(&local_68,socket,trace);
  if (local_68._M_string_length == 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,trace._M_str,trace._M_str + trace._M_len);
  std::operator+(&local_48,"Expected zero-sized frame:",&local_88);
  std::runtime_error::runtime_error(this,(string *)&local_48);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void s_recv_padding(zmq::socket_t *socket, std::string_view trace) {
    auto resp{s_recv<std::string>(socket, trace)};
    if (!resp.empty()) {
        throw std::runtime_error("Expected zero-sized frame:" +
                                 std::string(trace));
    }
}